

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O1

void __thiscall antlr::CharScanner::reportWarning(CharScanner *this,string *s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  
  iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0x1a])();
  iVar1 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar1));
  if (iVar1 == 0) {
    pcVar4 = "warning: ";
    lVar3 = 9;
  }
  else {
    iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0x1a])(this);
    pcVar4 = *(char **)CONCAT44(extraout_var_00,iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x30c658);
    }
    else {
      sVar2 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar2);
    }
    pcVar4 = ": warning: ";
    lVar3 = 0xb;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar3);
  pcVar4 = (s->_M_dataplus)._M_p;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x30c658);
  }
  else {
    sVar2 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void CharScanner::reportWarning(const ANTLR_USE_NAMESPACE(std)string& s)
{
	if (getFilename() == "")
		ANTLR_USE_NAMESPACE(std)cerr << "warning: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
	else
		ANTLR_USE_NAMESPACE(std)cerr << getFilename().c_str() << ": warning: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
}